

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

MODIFIED_HANDLE modified_create(void)

{
  AMQP_VALUE pAVar1;
  MODIFIED_HANDLE local_10;
  MODIFIED_INSTANCE *modified_instance;
  
  local_10 = (MODIFIED_HANDLE)malloc(8);
  if (local_10 != (MODIFIED_HANDLE)0x0) {
    pAVar1 = amqpvalue_create_composite_with_ulong_descriptor(0x27);
    local_10->composite_value = pAVar1;
    if (local_10->composite_value == (AMQP_VALUE)0x0) {
      free(local_10);
      local_10 = (MODIFIED_HANDLE)0x0;
    }
  }
  return local_10;
}

Assistant:

MODIFIED_HANDLE modified_create(void)
{
    MODIFIED_INSTANCE* modified_instance = (MODIFIED_INSTANCE*)malloc(sizeof(MODIFIED_INSTANCE));
    if (modified_instance != NULL)
    {
        modified_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(39);
        if (modified_instance->composite_value == NULL)
        {
            free(modified_instance);
            modified_instance = NULL;
        }
    }

    return modified_instance;
}